

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O0

vector vector_create_reserve(size_t type_size,size_t capacity)

{
  void *pvVar1;
  ulong in_RSI;
  size_t in_RDI;
  vector v;
  size_t local_28;
  vector local_8;
  
  if (in_RDI == 0) {
    log_write_impl_va("metacall",0x6d,"vector_create_reserve",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                      ,LOG_LEVEL_ERROR,"Vector invalid type size");
    local_8 = (vector)0x0;
  }
  else {
    local_8 = (vector)malloc(0x20);
    if (local_8 == (vector)0x0) {
      log_write_impl_va("metacall",0x57,"vector_create_reserve",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,LOG_LEVEL_ERROR,"Vector allocation error");
      local_8 = (vector)0x0;
    }
    else {
      local_8->type_size = in_RDI;
      local_28 = in_RSI;
      if (in_RSI < 0x10) {
        local_28 = 0x10;
      }
      local_8->capacity = local_28;
      local_8->size = 0;
      pvVar1 = malloc(local_8->capacity * local_8->type_size);
      local_8->data = pvVar1;
      if (local_8->data == (void *)0x0) {
        log_write_impl_va("metacall",99,"vector_create_reserve",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                          ,LOG_LEVEL_ERROR,"Vector internal allocation error");
        free(local_8);
        local_8 = (vector)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

vector vector_create_reserve(size_t type_size, size_t capacity)
{
	if (type_size > 0)
	{
		vector v = malloc(sizeof(struct vector_type));

		if (v == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Vector allocation error");

			return NULL;
		}

		v->type_size = type_size;
		v->capacity = (capacity < VECTOR_CAPACITY_MIN) ? VECTOR_CAPACITY_MIN : capacity;
		v->size = 0;
		v->data = malloc(v->capacity * v->type_size);

		if (v->data == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Vector internal allocation error");

			free(v);

			return NULL;
		}

		return v;
	}

	log_write("metacall", LOG_LEVEL_ERROR, "Vector invalid type size");

	return NULL;
}